

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet.c
# Opt level: O2

int pt_pkt_read_ip(pt_packet_ip *packet,uint8_t *pos,pt_config *config)

{
  uint64_t uVar1;
  uint uVar2;
  uint8_t *pos_00;
  pt_ip_compression pVar3;
  long lStack_20;
  
  if (config == (pt_config *)0x0 || (pos == (uint8_t *)0x0 || packet == (pt_packet_ip *)0x0)) {
    return -1;
  }
  pVar3 = (pt_ip_compression)(*pos >> 5);
  uVar2 = 0xfffffffb;
  if (pt_ipc_full < pVar3) {
    return -5;
  }
  pos_00 = pos + 1;
  switch(pVar3) {
  case pt_ipc_suppressed:
    if (config->end < pos_00) goto LAB_0010cd22;
    uVar2 = 1;
    uVar1 = 0;
    goto LAB_0010cd34;
  case pt_ipc_update_16:
    lStack_20 = 2;
    break;
  case pt_ipc_update_32:
    lStack_20 = 4;
    break;
  default:
    lStack_20 = 6;
    break;
  case pt_ipc_update_48|pt_ipc_update_16:
    goto switchD_0010ccf5_caseD_5;
  case pt_ipc_full:
    lStack_20 = 8;
  }
  if (config->end < pos_00 + lStack_20) {
LAB_0010cd22:
    uVar2 = 0xfffffff9;
  }
  else {
    uVar1 = pt_pkt_read_value(pos_00,(uint)lStack_20);
    uVar2 = (uint)lStack_20 | 1;
LAB_0010cd34:
    packet->ipc = pVar3;
    packet->ip = uVar1;
  }
switchD_0010ccf5_caseD_5:
  return uVar2;
}

Assistant:

int pt_pkt_read_ip(struct pt_packet_ip *packet, const uint8_t *pos,
		   const struct pt_config *config)
{
	uint64_t ip;
	uint8_t ipc;
	int ipsize;

	if (!packet || !pos || !config)
		return -pte_internal;

	ipc = (*pos++ >> pt_opm_ipc_shr) & pt_opm_ipc_shr_mask;

	ip = 0ull;
	ipsize = pt_pkt_ip_size((enum pt_ip_compression) ipc);
	if (ipsize < 0)
		return ipsize;

	if (config->end < pos + ipsize)
		return -pte_eos;

	if (ipsize)
		ip = pt_pkt_read_value(pos, ipsize);

	packet->ipc = (enum pt_ip_compression) ipc;
	packet->ip = ip;

	return ipsize + 1;
}